

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Intrinsics.cpp
# Opt level: O3

Value * __thiscall
soul::CompileTimeIntrinsicEvaluation::perform<double,double>
          (Value *__return_storage_ptr__,CompileTimeIntrinsicEvaluation *this,
          ArrayView<soul::Value> args,_func_double_double_double_double *fn)

{
  Value *extraout_RAX;
  double dVar1;
  double dVar2;
  double dVar3;
  PackedData local_30;
  
  if ((long)args.s - (long)this == 0xc0) {
    soul::Value::getData(&local_30,(Value *)this);
    dVar1 = soul::Value::PackedData::getAsDouble(&local_30);
    soul::Value::getData(&local_30,(Value *)(this + 0x40));
    dVar2 = soul::Value::PackedData::getAsDouble(&local_30);
    soul::Value::getData(&local_30,(Value *)(this + 0x80));
    dVar3 = soul::Value::PackedData::getAsDouble(&local_30);
    if (dVar1 <= dVar3) {
      dVar3 = dVar1;
    }
    soul::Value::Value(__return_storage_ptr__,
                       (double)(-(ulong)(dVar1 < dVar2) & (ulong)dVar2 |
                               ~-(ulong)(dVar1 < dVar2) & (ulong)dVar3));
    return extraout_RAX;
  }
  throwInternalCompilerError("args.size() == 3","perform",0x2e);
}

Assistant:

IntrinsicType getIntrinsicTypeFromName (std::string_view s)
{
    #define SOUL_MATCH_INTRINSIC(i)  if (s == #i) return IntrinsicType::i;
    SOUL_INTRINSICS (SOUL_MATCH_INTRINSIC)
    #undef SOUL_MATCH_INTRINSIC

    return IntrinsicType::none;
}